

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple_ast.h
# Opt level: O3

bool __thiscall
cashew::JSPrinter::needParens(JSPrinter *this,Ref parent,Ref child,int childPosition)

{
  char cVar1;
  int iVar2;
  int iVar3;
  Ref *pRVar4;
  undefined8 *puVar5;
  Value *local_40;
  Ref child_local;
  Ref parent_local;
  
  local_40 = child.inst;
  child_local = parent;
  iVar2 = getPrecedence(this,parent,true);
  iVar3 = getPrecedence(this,child,false);
  if (iVar2 < iVar3) {
    return true;
  }
  if (iVar3 < iVar2) {
    return false;
  }
  if ((parent.inst)->type == Array) {
    pRVar4 = (Ref *)cashew::Ref::operator[]((uint)&child_local);
    cVar1 = cashew::Ref::operator==(pRVar4,(IString *)&UNARY_PREFIX);
    if (cVar1 != '\0') {
      pRVar4 = (Ref *)cashew::Ref::operator[]((uint)&local_40);
      cVar1 = cashew::Ref::operator==(pRVar4,(IString *)&UNARY_PREFIX);
      if (cVar1 == '\0') {
        __assert_fail("child[0] == UNARY_PREFIX",
                      "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/emscripten-optimizer/simple_ast.h"
                      ,0x471,"bool cashew::JSPrinter::needParens(Ref, Ref, int)");
      }
      pRVar4 = (Ref *)cashew::Ref::operator[]((uint)&child_local);
      cVar1 = cashew::Ref::operator==(pRVar4,(IString *)&PLUS);
      if (cVar1 == '\0') {
        pRVar4 = (Ref *)cashew::Ref::operator[]((uint)&child_local);
        cVar1 = cashew::Ref::operator==(pRVar4,(IString *)&MINUS);
        if (cVar1 == '\0') goto LAB_00178510;
      }
      pRVar4 = (Ref *)cashew::Ref::operator[]((uint)&local_40);
      puVar5 = (undefined8 *)cashew::Ref::operator[]((uint)&child_local);
      cVar1 = cashew::Ref::operator==(pRVar4,(Value *)*puVar5);
      if (childPosition == 0) {
        return true;
      }
      if (cVar1 != '\0') {
        return true;
      }
      goto LAB_00178518;
    }
  }
LAB_00178510:
  if (childPosition == 0) {
    return true;
  }
LAB_00178518:
  if (iVar3 < 0) {
    return false;
  }
  cVar1 = cashew::OperatorClass::getRtl(iVar2);
  if (cVar1 == '\0') {
    return 0 < childPosition;
  }
  return SUB41((uint)childPosition >> 0x1f,0);
}

Assistant:

bool needParens(Ref parent, Ref child, int childPosition) {
    int parentPrecedence = getPrecedence(parent, true);
    int childPrecedence = getPrecedence(child, false);

    if (childPrecedence > parentPrecedence) {
      return true; // child is definitely a danger
    }
    if (childPrecedence < parentPrecedence) {
      return false; //          definitely cool
    }
    // equal precedence, so associativity (rtl/ltr) is what matters
    // (except for some exceptions, where multiple operators can combine into
    // confusion)
    if (parent->isArray() && parent[0] == UNARY_PREFIX) {
      assert(child[0] == UNARY_PREFIX);
      if ((parent[1] == PLUS || parent[1] == MINUS) && child[1] == parent[1]) {
        // cannot emit ++x when we mean +(+x)
        return true;
      }
    }
    if (childPosition == 0) {
      return true; // child could be anywhere, so always paren
    }
    if (childPrecedence < 0) {
      return false; // both precedences are safe
    }
    // check if child is on the dangerous side
    if (OperatorClass::getRtl(parentPrecedence)) {
      return childPosition < 0;
    } else {
      return childPosition > 0;
    }
  }